

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall CVmObjByteArray::notify_delete(CVmObjByteArray *this,int param_2)

{
  unsigned_long uVar1;
  CVmVarHeap *pCVar2;
  CVmObjByteArray *in_RDI;
  uchar **pgp;
  size_t pg;
  size_t bytes_rem;
  size_t slot_cnt;
  uchar ***slotp;
  size_t slot;
  ulong local_50;
  uchar **local_40;
  ulong local_38;
  ulong local_30;
  uchar ***local_20;
  ulong local_18;
  
  if ((in_RDI->super_CVmObject).ext_ != (char *)0x0) {
    uVar1 = get_element_count((CVmObjByteArray *)0x2c569d);
    if (uVar1 == 0) {
      local_50 = 0;
    }
    else {
      uVar1 = get_element_count((CVmObjByteArray *)0x2c56b6);
      local_50 = (uVar1 >> 0x1c) + 1;
    }
    local_30 = get_element_count((CVmObjByteArray *)0x2c56d7);
    local_18 = 0;
    local_20 = get_page_table_array(in_RDI);
    for (; local_18 < local_50; local_18 = local_18 + 1) {
      local_38 = 0;
      local_40 = *local_20;
      for (; local_38 < 0x2000 && local_30 != 0; local_38 = local_38 + 1) {
        free(*local_40);
        if (local_30 < 0x8001) {
          local_30 = 0;
        }
        else {
          local_30 = local_30 - 0x8000;
        }
        local_40 = local_40 + 1;
      }
      free(*local_20);
      local_20 = local_20 + 1;
    }
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,(in_RDI->super_CVmObject).ext_);
  }
  return;
}

Assistant:

void CVmObjByteArray::notify_delete(VMG_ int /*in_root_set*/)
{
    size_t slot;
    unsigned char ***slotp;
    size_t slot_cnt;
    size_t bytes_rem;

    /* if we have no extension, there's nothing to do */
    if (ext_ == 0)
        return;

    /* calculate the number of second-level page table slots */
    slot_cnt = (size_t)(get_element_count() == 0
                        ? 0
                        : ((get_element_count() >> 28) + 1));

    /* we have all of the bytes in the array left do delete */
    bytes_rem = get_element_count();

    /* traverse the list of second-level page tables and delete each one */
    for (slot = 0, slotp = get_page_table_array() ; slot < slot_cnt ;
         ++slot, ++slotp)
    {
        size_t pg;
        unsigned char **pgp;
        
        /* traverse each page in this page table */
        for (pg = 0, pgp = *slotp ; pg < 8*1024 && bytes_rem != 0 ;
             ++pg, ++pgp)
        {
            /* delete this page */
            t3free(*pgp);

            /* 
             *   deduct this page's size from the remaining bytes to delete
             *   - the page size is up to 32k, but no more than the
             *   remaining size
             */
            if (bytes_rem > 32*1024)
                bytes_rem -= 32*1024;
            else
                bytes_rem = 0;
        }

        /* delete this page table */
        t3free(*slotp);
    }

    /* free our extension */
    G_mem->get_var_heap()->free_mem(ext_);
}